

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O2

void __thiscall
burst::dynamic_tuple::dynamic_tuple<int,bool,double,void>
          (dynamic_tuple *this,int *head,bool *tail,double *tail_1)

{
  this->m_capacity = 0x10;
  std::make_unique<signed_char[]>((size_t)&this->m_data);
  (this->m_objects).
  super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_volume = 0;
  (this->m_objects).
  super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_objects).
  super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  push_back_no_realloc<int>(this,head);
  push_back_no_realloc<bool>(this,tail);
  push_back_no_realloc<double>(this,tail_1);
  return;
}

Assistant:

explicit dynamic_tuple (Head && head, Tail && ... tail):
            m_capacity(aligned_volume_v<Head, Tail...>),
            m_data(std::make_unique<std::int8_t[]>(m_capacity))
        {
            try
            {
                push_back_no_realloc(std::forward<Head>(head));
                BURST_EXPAND_VARIADIC(push_back_no_realloc(std::forward<Tail>(tail)));
            }
            catch (...)
            {
                destroy_all();
                throw;
            }
        }